

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomWidget::read(DomWidget *this,int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  DomProperty *pDVar5;
  DomRow *this_00;
  DomColumn *this_01;
  DomItem *this_02;
  DomLayout *this_03;
  DomWidget *this_04;
  DomAction *this_05;
  DomActionGroup *this_06;
  DomActionRef *this_07;
  char16_t *pcVar6;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  undefined4 in_register_00000034;
  QString *pQVar7;
  char *pcVar8;
  QList<DomProperty_*> *this_08;
  long lVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QString local_a0;
  char *local_88;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  pQVar7 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar9 = 0;
    do {
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar9 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar9 + 0x10);
      if ((local_68.m_size == 5) &&
         (QVar10.m_data = local_68.m_data, QVar10.m_size = 5, QVar14.m_data = L"class",
         QVar14.m_size = 5, cVar2 = QtPrivate::equalStrings(QVar10,QVar14), cVar2 != '\0')) {
        QString::QString(&local_a0,*(QChar **)(local_50.ptr + lVar9 + 0x50),
                         *(longlong *)(local_50.ptr + lVar9 + 0x58));
        QString::operator=(&this->m_attr_class,&local_a0);
        this->m_has_attr_class = true;
LAB_0015629d:
        piVar1 = (int *)CONCAT44(local_a0.d.d._4_4_,local_a0.d.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_a0.d.d._4_4_,local_a0.d.d._0_4_),2,0x10);
          }
        }
      }
      else {
        if ((local_68.m_size == 4) &&
           (QVar11.m_data = local_68.m_data, QVar11.m_size = 4, QVar15.m_data = L"name",
           QVar15.m_size = 4, cVar2 = QtPrivate::equalStrings(QVar11,QVar15), cVar2 != '\0')) {
          QString::QString(&local_a0,*(QChar **)(local_50.ptr + lVar9 + 0x50),
                           *(longlong *)(local_50.ptr + lVar9 + 0x58));
          QString::operator=(&this->m_attr_name,&local_a0);
          this->m_has_attr_name = true;
          goto LAB_0015629d;
        }
        if ((local_68.m_size != 6) ||
           (QVar12.m_data = local_68.m_data, QVar12.m_size = 6, QVar16.m_data = L"native",
           QVar16.m_size = 6, cVar2 = QtPrivate::equalStrings(QVar12,QVar16), cVar2 == '\0')) {
          local_80.a.m_size = 0x15;
          local_80.a.m_data = "Unexpected attribute ";
          local_80.b = &local_68;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_a0,&local_80);
          QXmlStreamReader::raiseError(pQVar7);
          goto LAB_0015629d;
        }
        if (*(long *)(local_50.ptr + lVar9 + 0x58) == 4) {
          QVar13.m_data = *(storage_type_conflict **)(local_50.ptr + lVar9 + 0x50);
          QVar13.m_size = 4;
          QVar17.m_data = L"true";
          QVar17.m_size = 4;
          uVar3 = QtPrivate::equalStrings(QVar13,QVar17);
        }
        else {
          uVar3 = false;
        }
        this->m_attr_native = (bool)uVar3;
        this->m_has_attr_native = true;
      }
      lVar9 = lVar9 + 0x68;
    } while (local_50.size * 0x68 - lVar9 != 0);
  }
  iVar4 = QXmlStreamReader::error();
  if (iVar4 == 0) {
    do {
      iVar4 = QXmlStreamReader::readNext();
      if (iVar4 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QStringView)QXmlStreamReader::name();
        QVar18.m_data = L"class";
        QVar18.m_size = 5;
        iVar4 = QtPrivate::compareStrings(local_68,QVar18,CaseInsensitive);
        if (iVar4 == 0) {
          QXmlStreamReader::readElementText(&local_a0,pQVar7,0);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)&this->m_class,(this->m_class).d.size,&local_a0);
          QList<QString>::end(&this->m_class);
LAB_001566a4:
          piVar1 = (int *)CONCAT44(local_a0.d.d._4_4_,local_a0.d.d._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_a0.d.d._4_4_,local_a0.d.d._0_4_),2,0x10);
            }
          }
        }
        else {
          QVar19.m_data = L"property";
          QVar19.m_size = 8;
          pcVar6 = L"property";
          iVar4 = QtPrivate::compareStrings(local_68,QVar19,CaseInsensitive);
          if (iVar4 == 0) {
            pDVar5 = (DomProperty *)operator_new(0x178);
            memset(pDVar5,0,0x178);
            DomProperty::read(pDVar5,__fd,__buf_00,(size_t)pcVar6);
            local_a0.d.d._0_4_ = SUB84(pDVar5,0);
            local_a0.d.d._4_4_ = (undefined4)((ulong)pDVar5 >> 0x20);
            QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
                      ((QPodArrayOps<DomProperty*> *)&this->m_property,(this->m_property).d.size,
                       (DomProperty **)&local_a0);
            this_08 = &this->m_property;
LAB_0015675a:
            QList<DomProperty_*>::end(this_08);
          }
          else {
            QVar20.m_data = L"script";
            QVar20.m_size = 6;
            iVar4 = QtPrivate::compareStrings(local_68,QVar20,CaseInsensitive);
            if (iVar4 == 0) {
              pcVar8 = "Omitting deprecated element <script>.";
            }
            else {
              QVar21.m_data = L"widgetdata";
              QVar21.m_size = 10;
              iVar4 = QtPrivate::compareStrings(local_68,QVar21,CaseInsensitive);
              if (iVar4 != 0) {
                QVar22.m_data = L"attribute";
                QVar22.m_size = 9;
                pcVar6 = L"attribute";
                iVar4 = QtPrivate::compareStrings(local_68,QVar22,CaseInsensitive);
                if (iVar4 != 0) {
                  QVar23.m_data = L"row";
                  QVar23.m_size = 3;
                  pcVar6 = L"row";
                  iVar4 = QtPrivate::compareStrings(local_68,QVar23,CaseInsensitive);
                  if (iVar4 == 0) {
                    this_00 = (DomRow *)operator_new(0x20);
                    *(undefined8 *)this_00 = 0;
                    (this_00->m_property).d.d = (Data *)0x0;
                    (this_00->m_property).d.ptr = (DomProperty **)0x0;
                    (this_00->m_property).d.size = 0;
                    DomRow::read(this_00,__fd,__buf_02,(size_t)pcVar6);
                    local_a0.d.d._0_4_ = SUB84(this_00,0);
                    local_a0.d.d._4_4_ = (undefined4)((ulong)this_00 >> 0x20);
                    QtPrivate::QPodArrayOps<DomRow*>::emplace<DomRow*&>
                              ((QPodArrayOps<DomRow*> *)&this->m_row,(this->m_row).d.size,
                               (DomRow **)&local_a0);
                    QList<DomRow_*>::end(&this->m_row);
                  }
                  else {
                    QVar24.m_data = L"column";
                    QVar24.m_size = 6;
                    pcVar6 = L"column";
                    iVar4 = QtPrivate::compareStrings(local_68,QVar24,CaseInsensitive);
                    if (iVar4 == 0) {
                      this_01 = (DomColumn *)operator_new(0x20);
                      *(undefined8 *)this_01 = 0;
                      (this_01->m_property).d.d = (Data *)0x0;
                      (this_01->m_property).d.ptr = (DomProperty **)0x0;
                      (this_01->m_property).d.size = 0;
                      DomColumn::read(this_01,__fd,__buf_03,(size_t)pcVar6);
                      local_a0.d.d._0_4_ = SUB84(this_01,0);
                      local_a0.d.d._4_4_ = (undefined4)((ulong)this_01 >> 0x20);
                      QtPrivate::QPodArrayOps<DomColumn*>::emplace<DomColumn*&>
                                ((QPodArrayOps<DomColumn*> *)&this->m_column,(this->m_column).d.size
                                 ,(DomColumn **)&local_a0);
                      QList<DomColumn_*>::end(&this->m_column);
                    }
                    else {
                      QVar25.m_data = L"item";
                      QVar25.m_size = 4;
                      pcVar6 = L"item";
                      iVar4 = QtPrivate::compareStrings(local_68,QVar25,CaseInsensitive);
                      if (iVar4 == 0) {
                        this_02 = (DomItem *)operator_new(0x48);
                        this_02->m_attr_row = 0;
                        this_02->m_has_attr_row = false;
                        *(undefined3 *)&this_02->field_0x5 = 0;
                        this_02->m_attr_column = 0;
                        this_02->m_has_attr_column = false;
                        *(undefined3 *)&this_02->field_0xd = 0;
                        *(undefined8 *)&this_02->m_children = 0;
                        (this_02->m_property).d.d = (Data *)0x0;
                        (this_02->m_property).d.ptr = (DomProperty **)0x0;
                        (this_02->m_property).d.size = 0;
                        (this_02->m_item).d.d = (Data *)0x0;
                        (this_02->m_item).d.ptr = (DomItem **)0x0;
                        (this_02->m_item).d.size = 0;
                        DomItem::read(this_02,__fd,__buf_04,(size_t)pcVar6);
                        local_a0.d.d._0_4_ = SUB84(this_02,0);
                        local_a0.d.d._4_4_ = (undefined4)((ulong)this_02 >> 0x20);
                        QtPrivate::QPodArrayOps<DomItem*>::emplace<DomItem*&>
                                  ((QPodArrayOps<DomItem*> *)&this->m_item,(this->m_item).d.size,
                                   (DomItem **)&local_a0);
                        QList<DomItem_*>::end(&this->m_item);
                      }
                      else {
                        QVar26.m_data = L"layout";
                        QVar26.m_size = 6;
                        pcVar6 = L"layout";
                        iVar4 = QtPrivate::compareStrings(local_68,QVar26,CaseInsensitive);
                        if (iVar4 == 0) {
                          this_03 = (DomLayout *)operator_new(0x128);
                          memset(this_03,0,0x128);
                          DomLayout::read(this_03,__fd,__buf_05,(size_t)pcVar6);
                          local_a0.d.d._0_4_ = SUB84(this_03,0);
                          local_a0.d.d._4_4_ = (undefined4)((ulong)this_03 >> 0x20);
                          QtPrivate::QPodArrayOps<DomLayout*>::emplace<DomLayout*&>
                                    ((QPodArrayOps<DomLayout*> *)&this->m_layout,
                                     (this->m_layout).d.size,(DomLayout **)&local_a0);
                          QList<DomLayout_*>::end(&this->m_layout);
                        }
                        else {
                          QVar27.m_data = L"widget";
                          QVar27.m_size = 6;
                          pcVar6 = L"widget";
                          iVar4 = QtPrivate::compareStrings(local_68,QVar27,CaseInsensitive);
                          if (iVar4 == 0) {
                            this_04 = (DomWidget *)operator_new(0x160);
                            memset(this_04,0,0x160);
                            read(this_04,__fd,__buf_06,(size_t)pcVar6);
                            local_a0.d.d._0_4_ = SUB84(this_04,0);
                            local_a0.d.d._4_4_ = (undefined4)((ulong)this_04 >> 0x20);
                            QtPrivate::QPodArrayOps<DomWidget*>::emplace<DomWidget*&>
                                      ((QPodArrayOps<DomWidget*> *)&this->m_widget,
                                       (this->m_widget).d.size,(DomWidget **)&local_a0);
                            QList<DomWidget_*>::end(&this->m_widget);
                          }
                          else {
                            QVar28.m_data = L"action";
                            QVar28.m_size = 6;
                            pcVar6 = L"action";
                            iVar4 = QtPrivate::compareStrings(local_68,QVar28,CaseInsensitive);
                            if (iVar4 == 0) {
                              this_05 = (DomAction *)operator_new(0x70);
                              (this_05->m_attr_name).d.d = (Data *)0x0;
                              (this_05->m_attr_name).d.ptr = (char16_t *)0x0;
                              (this_05->m_attr_name).d.size = 0;
                              *(undefined8 *)&this_05->m_has_attr_name = 0;
                              (this_05->m_attr_menu).d.d = (Data *)0x0;
                              (this_05->m_attr_menu).d.ptr = (char16_t *)0x0;
                              (this_05->m_attr_menu).d.size = 0;
                              this_05->m_has_attr_menu = false;
                              *(undefined3 *)&this_05->field_0x39 = 0;
                              this_05->m_children = 0;
                              (this_05->m_property).d.d = (Data *)0x0;
                              (this_05->m_property).d.ptr = (DomProperty **)0x0;
                              (this_05->m_property).d.size = 0;
                              (this_05->m_attribute).d.d = (Data *)0x0;
                              (this_05->m_attribute).d.ptr = (DomProperty **)0x0;
                              (this_05->m_attribute).d.size = 0;
                              DomAction::read(this_05,__fd,__buf_07,(size_t)pcVar6);
                              local_a0.d.d._0_4_ = SUB84(this_05,0);
                              local_a0.d.d._4_4_ = (undefined4)((ulong)this_05 >> 0x20);
                              QtPrivate::QPodArrayOps<DomAction*>::emplace<DomAction*&>
                                        ((QPodArrayOps<DomAction*> *)&this->m_action,
                                         (this->m_action).d.size,(DomAction **)&local_a0);
                              QList<DomAction_*>::end(&this->m_action);
                            }
                            else {
                              QVar29.m_data = L"actiongroup";
                              QVar29.m_size = 0xb;
                              pcVar6 = L"actiongroup";
                              iVar4 = QtPrivate::compareStrings(local_68,QVar29,CaseInsensitive);
                              if (iVar4 == 0) {
                                this_06 = (DomActionGroup *)operator_new(0x80);
                                (this_06->m_attr_name).d.d = (Data *)0x0;
                                (this_06->m_attr_name).d.ptr = (char16_t *)0x0;
                                (this_06->m_attr_name).d.size = 0;
                                this_06->m_has_attr_name = false;
                                *(undefined3 *)&this_06->field_0x19 = 0;
                                this_06->m_children = 0;
                                (this_06->m_action).d.d = (Data *)0x0;
                                (this_06->m_action).d.ptr = (DomAction **)0x0;
                                (this_06->m_action).d.size = 0;
                                (this_06->m_actionGroup).d.d = (Data *)0x0;
                                (this_06->m_actionGroup).d.ptr = (DomActionGroup **)0x0;
                                (this_06->m_actionGroup).d.size = 0;
                                (this_06->m_property).d.d = (Data *)0x0;
                                (this_06->m_property).d.ptr = (DomProperty **)0x0;
                                (this_06->m_property).d.size = 0;
                                (this_06->m_attribute).d.d = (Data *)0x0;
                                (this_06->m_attribute).d.ptr = (DomProperty **)0x0;
                                (this_06->m_attribute).d.size = 0;
                                DomActionGroup::read(this_06,__fd,__buf_08,(size_t)pcVar6);
                                local_a0.d.d._0_4_ = SUB84(this_06,0);
                                local_a0.d.d._4_4_ = (undefined4)((ulong)this_06 >> 0x20);
                                QtPrivate::QPodArrayOps<DomActionGroup*>::emplace<DomActionGroup*&>
                                          ((QPodArrayOps<DomActionGroup*> *)&this->m_actionGroup,
                                           (this->m_actionGroup).d.size,(DomActionGroup **)&local_a0
                                          );
                                QList<DomActionGroup_*>::end(&this->m_actionGroup);
                              }
                              else {
                                QVar30.m_data = L"addaction";
                                QVar30.m_size = 9;
                                pcVar6 = L"addaction";
                                iVar4 = QtPrivate::compareStrings(local_68,QVar30,CaseInsensitive);
                                if (iVar4 != 0) {
                                  QVar31.m_data = L"zorder";
                                  QVar31.m_size = 6;
                                  iVar4 = QtPrivate::compareStrings(local_68,QVar31,CaseInsensitive)
                                  ;
                                  if (iVar4 == 0) {
                                    QXmlStreamReader::readElementText(&local_a0,pQVar7,0);
                                    QList<QString>::append(&this->m_zOrder,&local_a0);
                                  }
                                  else {
                                    local_80.a.m_size = 0x13;
                                    local_80.a.m_data = "Unexpected element ";
                                    local_80.b = &local_68;
                                    QStringBuilder<QLatin1String,_const_QStringView_&>::
                                    convertTo<QString>(&local_a0,&local_80);
                                    QXmlStreamReader::raiseError(pQVar7);
                                  }
                                  goto LAB_001566a4;
                                }
                                this_07 = (DomActionRef *)operator_new(0x20);
                                (this_07->m_attr_name).d.d = (Data *)0x0;
                                (this_07->m_attr_name).d.ptr = (char16_t *)0x0;
                                (this_07->m_attr_name).d.size = 0;
                                *(undefined8 *)&this_07->m_has_attr_name = 0;
                                DomActionRef::read(this_07,__fd,__buf_09,(size_t)pcVar6);
                                local_a0.d.d._0_4_ = SUB84(this_07,0);
                                local_a0.d.d._4_4_ = (undefined4)((ulong)this_07 >> 0x20);
                                QtPrivate::QPodArrayOps<DomActionRef*>::emplace<DomActionRef*&>
                                          ((QPodArrayOps<DomActionRef*> *)&this->m_addAction,
                                           (this->m_addAction).d.size,(DomActionRef **)&local_a0);
                                QList<DomActionRef_*>::end(&this->m_addAction);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0015675f;
                }
                pDVar5 = (DomProperty *)operator_new(0x178);
                memset(pDVar5,0,0x178);
                DomProperty::read(pDVar5,__fd,__buf_01,(size_t)pcVar6);
                local_a0.d.d._0_4_ = SUB84(pDVar5,0);
                local_a0.d.d._4_4_ = (undefined4)((ulong)pDVar5 >> 0x20);
                QtPrivate::QPodArrayOps<DomProperty*>::emplace<DomProperty*&>
                          ((QPodArrayOps<DomProperty*> *)&this->m_attribute,
                           (this->m_attribute).d.size,(DomProperty **)&local_a0);
                this_08 = &this->m_attribute;
                goto LAB_0015675a;
              }
              pcVar8 = "Omitting deprecated element <widgetdata>.";
            }
            local_88 = "default";
            local_a0.d.size._4_4_ = 0;
            local_a0.d._12_8_ = 0;
            local_a0.d.ptr._0_4_ = 0;
            local_a0.d.d._4_4_ = 0;
            local_a0.d.d._0_4_ = 2;
            QMessageLogger::warning((char *)&local_a0,pcVar8);
            QXmlStreamReader::skipCurrentElement();
          }
        }
      }
      else if (iVar4 == 5) break;
LAB_0015675f:
      iVar4 = QXmlStreamReader::error();
    } while (iVar4 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomWidget::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"class"_s) {
            setAttributeClass(attribute.value().toString());
            continue;
        }
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"native"_s) {
            setAttributeNative(attribute.value() == u"true"_s);
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"class"_s, Qt::CaseInsensitive)) {
                m_class.append(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"script"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <script>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"widgetdata"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <widgetdata>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            if (!tag.compare(u"row"_s, Qt::CaseInsensitive)) {
                auto *v = new DomRow();
                v->read(reader);
                m_row.append(v);
                continue;
            }
            if (!tag.compare(u"column"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColumn();
                v->read(reader);
                m_column.append(v);
                continue;
            }
            if (!tag.compare(u"item"_s, Qt::CaseInsensitive)) {
                auto *v = new DomItem();
                v->read(reader);
                m_item.append(v);
                continue;
            }
            if (!tag.compare(u"layout"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayout();
                v->read(reader);
                m_layout.append(v);
                continue;
            }
            if (!tag.compare(u"widget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomWidget();
                v->read(reader);
                m_widget.append(v);
                continue;
            }
            if (!tag.compare(u"action"_s, Qt::CaseInsensitive)) {
                auto *v = new DomAction();
                v->read(reader);
                m_action.append(v);
                continue;
            }
            if (!tag.compare(u"actiongroup"_s, Qt::CaseInsensitive)) {
                auto *v = new DomActionGroup();
                v->read(reader);
                m_actionGroup.append(v);
                continue;
            }
            if (!tag.compare(u"addaction"_s, Qt::CaseInsensitive)) {
                auto *v = new DomActionRef();
                v->read(reader);
                m_addAction.append(v);
                continue;
            }
            if (!tag.compare(u"zorder"_s, Qt::CaseInsensitive)) {
                m_zOrder.append(reader.readElementText());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}